

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O1

MicroRep * __thiscall
google::protobuf::internal::MicroString::AllocateMicroRep
          (MicroString *this,size_t size,Arena *arena)

{
  MicroRep *pMVar1;
  void *pvVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  MicroString aMStack_28 [2];
  
  uVar3 = size + 9 & 0xfffffffffffffff8;
  if (arena == (Arena *)0x0) {
    if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
      pvVar2 = operator_new(uVar3);
      auVar4._8_8_ = uVar3;
      auVar4._0_8_ = pvVar2;
    }
    else {
      auVar4 = (**(code **)(in_FS_OFFSET + -0x48))(uVar3,*(undefined8 *)(in_FS_OFFSET + -0x40));
    }
    pMVar1 = auVar4._0_8_;
    uVar3 = auVar4._8_8_ - 2;
    if (0xfe < uVar3) {
      uVar3 = 0xff;
    }
  }
  else {
    uVar3 = uVar3 - 2;
    if (0xfe < uVar3) {
      uVar3 = 0xff;
    }
    pMVar1 = (MicroRep *)Arena::Allocate(arena,(ulong)((int)uVar3 + 9U & 0x1f8));
  }
  pMVar1->capacity = (uint8_t)uVar3;
  pMVar1->size = (uint8_t)size;
  this->rep_ = pMVar1 + 1;
  if (((ulong)pMVar1 & 2) == 0) {
    return pMVar1;
  }
  AllocateMicroRep(aMStack_28);
}

Assistant:

MicroString::MicroRep* MicroString::AllocateMicroRep(size_t size,
                                                     Arena* arena) {
  MicroRep* h;
  size_t capacity = size;
  if (arena == nullptr) {
    const internal::SizedPtr alloc = internal::AllocateAtLeast(
        ArenaAlignDefault::Ceil(MicroRepSize(capacity)));
    // Maybe we rounded up too much.
    capacity = std::min(kMaxMicroRepCapacity, alloc.n - sizeof(MicroRep));
    h = reinterpret_cast<MicroRep*>(alloc.p);
  } else {
    capacity =
        ArenaAlignDefault::Ceil(capacity + sizeof(MicroRep)) - sizeof(MicroRep);
    capacity = std::min(kMaxMicroRepCapacity, capacity);
    auto* alloc = arena->AllocateAligned(MicroRepSize(capacity));
    h = reinterpret_cast<MicroRep*>(alloc);
  }
  h->capacity = capacity;
  h->SetInitialSize(size);

  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) + kIsMicroRepTag);
  ABSL_DCHECK(is_micro_rep());

  return h;
}